

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void Error::reportErrorAtToken
               (ostream *out,string *phase,shared_ptr<const_Readable> *reader,
               shared_ptr<Token> *token,string *message)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  string local_80 [8];
  string line;
  string arrow;
  
  peVar1 = (token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->tokenType == EndOfFile) {
    poVar3 = std::operator<<(out,"At end of file an error was discovered during ");
    poVar3 = std::operator<<(poVar3,(string *)phase);
    poVar3 = std::operator<<(poVar3," phase:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)message);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  peVar2 = (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  arrow.field_2._8_8_ = phase;
  (*peVar2->_vptr_Readable[4])(local_80,peVar2,(peVar1->sourceIndex - peVar1->sourceColumn) + 1);
  line.field_2._8_8_ = &arrow._M_string_length;
  arrow._M_dataplus._M_p = (pointer)0x0;
  arrow._M_string_length._0_1_ = 0;
  for (uVar4 = 1;
      uVar4 < ((token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sourceColumn;
      uVar4 = uVar4 + 1) {
    std::__cxx11::string::append(line.field_2._M_local_buf + 8);
  }
  std::__cxx11::string::append(line.field_2._M_local_buf + 8);
  poVar3 = std::operator<<(out,"On line ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," at column ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," within source index at ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," an error was discovered during ");
  poVar3 = std::operator<<(poVar3,(string *)arrow.field_2._8_8_);
  poVar3 = std::operator<<(poVar3," phase:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,(string *)message);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,local_80);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,(string *)(line.field_2._M_local_buf + 8));
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void Error::reportErrorAtToken(
    std::ostream & out,
    const std::string & phase,
    const std::shared_ptr<const Readable>& reader,
    const std::shared_ptr<Token>& token,
    const std::string & message) {

  if (token->tokenType == TokenType::EndOfFile) {
    out
      << "At end of file an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl << std::endl;

  } else {
    std::size_t startofLine = token->sourceIndex - (token->sourceColumn - 1);
    auto line = reader->getLineFromIndex(startofLine);

    std::string arrow;

    for (std::size_t i = 1; i < token->sourceColumn; i++) {
      arrow.append("~");
    }

    arrow.append("^");

    out
      << "On line " << token->sourceLine
      << " at column " << token->sourceColumn
      << " within source index at " << token->sourceIndex
      << " an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl
      << line << std::endl
      << arrow << std::endl << std::endl;
  }
}